

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::FeatureDescription::MergePartialFromCodedStream
          (FeatureDescription *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  string *psVar6;
  FeatureType *value;
  char *field_name;
  char cVar7;
  int size;
  ulong uVar8;
  pointer data;
  
LAB_001879a9:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001879cc;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001879cc:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    uVar4 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_001879ed:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar5 != 3) {
        if (uVar5 == 2) {
          if (cVar7 != '\x12') goto LAB_001879ed;
          psVar6 = mutable_shortdescription_abi_cxx11_(this);
          bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
          if (!bVar3) {
            return false;
          }
          psVar6 = (this->shortdescription_).ptr_;
          data = (psVar6->_M_dataplus)._M_p;
          size = (int)psVar6->_M_string_length;
          field_name = "CoreML.Specification.FeatureDescription.shortDescription";
        }
        else {
          if ((uVar5 != 1) || (cVar7 != '\n')) goto LAB_001879ed;
          psVar6 = mutable_name_abi_cxx11_(this);
          bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
          if (!bVar3) {
            return false;
          }
          psVar6 = (this->name_).ptr_;
          data = (psVar6->_M_dataplus)._M_p;
          size = (int)psVar6->_M_string_length;
          field_name = "CoreML.Specification.FeatureDescription.name";
        }
        bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,size,PARSE,field_name);
        if (!bVar3) {
          return false;
        }
        goto LAB_001879a9;
      }
      if (cVar7 != '\x1a') goto LAB_001879ed;
      value = mutable_type(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::FeatureType>(input,value);
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FeatureDescription::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FeatureDescription)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.FeatureDescription.name"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string shortDescription = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_shortdescription()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->shortdescription().data(), this->shortdescription().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.FeatureDescription.shortDescription"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureType type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FeatureDescription)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FeatureDescription)
  return false;
#undef DO_
}